

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::processElement(Tokenizer *this,iterator *it)

{
  Tokenizer *pTVar1;
  pointer pRVar2;
  const_iterator __position;
  pointer pTVar3;
  pointer pvVar4;
  size_t sVar5;
  __type _Var6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  Tokenizer *pTVar8;
  Token *token;
  pointer __lhs;
  pointer pTVar9;
  iterator insertIt;
  iterator nextIt;
  size_t index;
  Token originalToken;
  
  pTVar1 = (Tokenizer *)it->_M_node;
  if (pTVar1 != this) {
    pTVar8 = pTVar1;
    while (*(char *)((long)&(pTVar8->invalidToken).line + 4) == '\0') {
      if ((int)(pTVar8->invalidToken).line == 1) {
        __rhs = &Token::identifierValue
                           ((Token *)&(pTVar8->tokens).
                                      super__List_base<Token,_std::allocator<Token>_>._M_impl.
                                      _M_node._M_size)->_name;
        pRVar2 = (this->replacements).
                 super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__lhs = (this->replacements).
                     super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>
                     ._M_impl.super__Vector_impl_data._M_start; __lhs != pRVar2; __lhs = __lhs + 1)
        {
          _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,__rhs);
          if (_Var6) {
            __position._M_node = it->_M_node->_M_next;
            Token::operator=((Token *)(it->_M_node + 1),
                             (__lhs->value).super__Vector_base<Token,_std::allocator<Token>_>.
                             _M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::list<Token,std::allocator<Token>>::
            insert<__gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>,void>
                      ((list<Token,std::allocator<Token>> *)this,__position,
                       (__lhs->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_start + 1,
                       (__lhs->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            if (*(int *)&it->_M_node[2]._M_next != 1) goto LAB_00144067;
            __rhs_00 = &Token::identifierValue((Token *)(it->_M_node + 1))->_name;
            bVar7 = std::operator!=(__rhs,__rhs_00);
            if (bVar7) goto LAB_00144067;
            break;
          }
        }
        bVar7 = SymbolTable::findEquation
                          (&Global.symbolTable,(Identifier *)__rhs,Global.FileInfo.FileNum,
                           Global.Section,&index);
        if (!bVar7) {
          pTVar8 = (Tokenizer *)it->_M_node;
          goto LAB_00144063;
        }
        nextIt = (iterator)it->_M_node;
        std::__advance<std::_List_iterator<Token>,long>(&nextIt,1);
        sVar5 = index;
        pvVar4 = equValues.
                 super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((Tokenizer *)nextIt._M_node != this) && (*(int *)&nextIt._M_node[2]._M_next == 0x21))
        break;
        originalToken.originalText._M_string_length = 0;
        originalToken.originalText.field_2._8_8_ = 0;
        originalToken.value.
        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
        _24_8_ = 0;
        originalToken.value.
        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        _M_index = '\0';
        originalToken.value.
        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._33_7_
             = 0;
        originalToken.value.
        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
        _8_8_ = 0;
        originalToken.value.
        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
        _16_8_ = 0;
        originalToken.type = Invalid;
        originalToken.checked = false;
        originalToken._21_3_ = 0;
        originalToken.value.
        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>._M_u.
        _M_rest._0_8_ = (undefined8)0;
        originalToken.line = 0;
        originalToken.column = 0;
        originalToken.originalText._M_dataplus._M_p = (pointer)&originalToken.originalText.field_2;
        originalToken.originalText.field_2._M_allocated_capacity = 0;
        std::__cxx11::list<Token,_std::allocator<Token>_>::insert
                  (&this->tokens,(const_iterator)nextIt._M_node,
                   ((long)equValues.
                          super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[index].
                          super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)equValues.
                         super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].
                         super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x60 - 1,&originalToken);
        Token::~Token(&originalToken);
        Token::Token(&originalToken,(Token *)(it->_M_node + 1));
        insertIt = (iterator)it->_M_node;
        pTVar3 = pvVar4[sVar5].super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pTVar9 = pvVar4[sVar5].super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start; pTVar9 != pTVar3; pTVar9 = pTVar9 + 1) {
          Token::operator=((Token *)(insertIt._M_node + 1),pTVar9);
          *(undefined4 *)&insertIt._M_node[1]._M_next = (undefined4)originalToken.line;
          *(undefined4 *)((long)&insertIt._M_node[1]._M_next + 4) = originalToken.line._4_4_;
          *(undefined4 *)&insertIt._M_node[1]._M_prev = (undefined4)originalToken.column;
          *(undefined4 *)((long)&insertIt._M_node[1]._M_prev + 4) = originalToken.column._4_4_;
          std::__advance<std::_List_iterator<Token>,long>(&insertIt,1);
        }
        Token::~Token(&originalToken);
      }
      else {
LAB_00144063:
        *(undefined1 *)((long)&(pTVar8->invalidToken).line + 4) = 1;
      }
LAB_00144067:
      pTVar8 = (Tokenizer *)it->_M_node;
    }
  }
  return pTVar1 != this;
}

Assistant:

bool Tokenizer::processElement(TokenList::iterator& it)
{
	if (it == tokens.end())
		return false;

	while (!(*it).checked)
	{
		bool replaced = false;
		if ((*it).type == TokenType::Identifier)
		{
			const Identifier &identifier = (*it).identifierValue();
			for (const Replacement& replacement: replacements)
			{
				// if the identifier matches, add all of its tokens
				if (replacement.identifier == identifier)
				{
					TokenList::iterator insertIt = it;
					++insertIt;
				
					// replace old token with the new tokens
					// replace the first token manually so that any iterators
					// are still guaranteed to be valid
					(*it) = replacement.value[0];
					tokens.insert(insertIt,replacement.value.begin()+1, replacement.value.end());

					// If the value at this position didn't change, then just keep going.
					// Otherwise we'd be stuck in an endless replace loop
					if ((*it).type != TokenType::Identifier || identifier != (*it).identifierValue())
						replaced = true;
					break;
				}
			}

			if (replaced)
				continue;

			// check for equs
			size_t index;
			if (Global.symbolTable.findEquation(identifier,Global.FileInfo.FileNum,Global.Section,index))
			{
				TokenList::iterator nextIt = it;
				std::advance(nextIt, 1);
			
				// check if this is another equ with the same name.
				// if so, keep equ redefinitions for later error handling
				if (nextIt != tokens.end() && nextIt->type == TokenType::Equ)
					break;

				// make room for the replacement tokens
				const std::vector<Token>& replacement = equValues[index];
				tokens.insert(nextIt, replacement.size()-1, {});

				// insert replacement tokens, while keeping the file info of the original token
				Token originalToken = *it;

				TokenList::iterator insertIt = it;
				for (const Token& token: replacement)
				{
					(*insertIt) = token;
					insertIt->line = originalToken.line;
					insertIt->column = originalToken.column;
					std::advance(insertIt, 1);
				}

				replaced = true;
				continue;
			}
		}

		if (!replaced)
			(*it).checked = true;
	}

	return true;
}